

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphListExtract(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex)

{
  Nwk_Vrt_t *pNext;
  Nwk_Vrt_t *pVertex_local;
  Nwk_Grf_t *p_local;
  
  if (pVertex->nEdges < 1) {
    __assert_fail("pVertex->nEdges > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                  ,0xf6,"void Nwk_ManGraphListExtract(Nwk_Grf_t *, Nwk_Vrt_t *)");
  }
  if (pVertex->nEdges == 1) {
    if (p->pVerts[pVertex[1].Id]->nEdges < 0x10) {
      Nwk_ManGraphListDelete(p,p->pLists1 + p->pVerts[pVertex[1].Id]->nEdges,pVertex);
    }
    else {
      Nwk_ManGraphListDelete(p,p->pLists1 + 0x10,pVertex);
    }
  }
  else if (pVertex->nEdges < 0x10) {
    Nwk_ManGraphListDelete(p,p->pLists2 + pVertex->nEdges,pVertex);
  }
  else {
    Nwk_ManGraphListDelete(p,p->pLists2 + 0x10,pVertex);
  }
  return;
}

Assistant:

static inline void Nwk_ManGraphListExtract( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex )
{
    Nwk_Vrt_t * pNext;
    assert( pVertex->nEdges > 0 );

    if ( pVertex->nEdges == 1 )
    {
        pNext = p->pVerts[ pVertex->pEdges[0] ];
        if ( pNext->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists1 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists1 + pNext->nEdges, pVertex );
    }
    else
    {
        if ( pVertex->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists2 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists2 + pVertex->nEdges, pVertex );
    }
}